

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kats_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  picnic_params_t param;
  picnic_params_t_conflict param_00;
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  int iVar4;
  pointer_conflict paVar5;
  _Vector_base<picnic_params_t,_std::allocator<picnic_params_t>_> local_48;
  
  if (argc == 2) {
    param_00 = argument_to_params(argv[1]);
    if (param_00 == PARAMETER_SET_INVALID) {
      poVar2 = std::operator<<((ostream *)&std::cout,"ERR: invalid test idx");
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar4 = 1;
    }
    else {
      iVar1 = anon_unknown.dwarf_362e::run_test(param_00);
      iVar4 = 0;
      if (iVar1 == 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"ERR: Picnic KAT test ");
        pcVar3 = (char *)picnic_get_param_name(param_00);
        poVar2 = std::operator<<(poVar2,pcVar3);
        poVar2 = std::operator<<(poVar2," FAILED");
        std::endl<char,std::char_traits<char>>(poVar2);
        iVar4 = -1;
      }
    }
  }
  else {
    all_supported_parameters();
    iVar4 = 0;
    for (paVar5 = local_48._M_impl.super__Vector_impl_data._M_start;
        paVar5 != local_48._M_impl.super__Vector_impl_data._M_finish; paVar5 = paVar5 + 1) {
      param = *paVar5;
      iVar1 = anon_unknown.dwarf_362e::run_test(param);
      if (iVar1 == 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"ERR: Picnic KAT test ");
        pcVar3 = (char *)picnic_get_param_name(param);
        poVar2 = std::operator<<(poVar2,pcVar3);
        poVar2 = std::operator<<(poVar2," FAILED");
        std::endl<char,std::char_traits<char>>(poVar2);
        iVar4 = -1;
      }
    }
    std::_Vector_base<picnic_params_t,_std::allocator<picnic_params_t>_>::~_Vector_base(&local_48);
  }
  return iVar4;
}

Assistant:

int main(int argc, char** argv) {
  if (argc == 2) {
    const picnic_params_t param = argument_to_params(argv[1]);
    if (param == PARAMETER_SET_INVALID) {
      std::cout << "ERR: invalid test idx" << std::endl;
      return 1;
    }

    const int t = run_test(param);
    if (!t) {
      std::cout << "ERR: Picnic KAT test " << picnic_get_param_name(param) << " FAILED"
                << std::endl;
      return -1;
    }
    return 0;
  }

  int ret = 0;
  for (const auto s : all_supported_parameters()) {
    const int t = run_test(s);
    if (!t) {
      std::cout << "ERR: Picnic KAT test " << picnic_get_param_name(s) << " FAILED" << std::endl;
      ret = -1;
    }
  }

  return ret;
}